

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O3

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)4>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset)

{
  pointer piVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  int *p;
  unsigned_long __n2;
  size_t __n;
  uint uVar8;
  pointer __src;
  size_t j;
  vector<int,_std::allocator<int>_> dad;
  allocator_type local_79;
  vector<int,_std::allocator<int>_> *local_78;
  Data2D<int> *local_70;
  vector<int,_std::allocator<int>_> local_68;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  __n = mset->num_dimensions;
  sVar5 = (size_t)mset->cache_num_indexes;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  sVar7 = (size_t)((int)__n * 2);
  __return_storage_ptr__->stride = sVar7;
  __return_storage_ptr__->num_strips = sVar5;
  local_78 = &__return_storage_ptr__->vec;
  local_70 = __return_storage_ptr__;
  ::std::vector<int,_std::allocator<int>_>::vector
            (local_78,sVar7 * sVar5,(value_type_conflict3 *)&local_68,&local_79);
  if (0 < (long)sVar5) {
    local_50 = __n * 4;
    sVar7 = 0;
    local_48 = sVar5;
    local_38 = __n;
    do {
      __src = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + mset->num_dimensions * sVar7;
      ::std::vector<int,_std::allocator<int>_>::vector(&local_68,__n,&local_79);
      p = (int *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_);
      local_40 = sVar7;
      if (__n == 0) {
        if (p != (int *)0x0) goto LAB_001bbf33;
      }
      else {
        memmove(p,__src,local_50);
        lVar6 = local_70->stride * sVar7;
        piVar1 = (local_70->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        p = (int *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
        sVar5 = 0;
        do {
          if (1 < p[sVar5]) {
            uVar8 = __src[sVar5];
            uVar2 = uVar8 + 1 >> 1;
            if ((int)uVar8 < 2) {
              uVar2 = 0xffffffff;
            }
            p[sVar5] = uVar2;
            iVar3 = MultiIndexSet::getSlot(mset,p);
            piVar1[lVar6 + sVar5 * 2] = iVar3;
            p = (int *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
            puVar4 = (uint *)(p + sVar5);
            uVar2 = *puVar4;
            if (iVar3 == -1 && 1 < (int)*puVar4) {
              do {
                uVar8 = uVar2;
                *puVar4 = uVar8 + 1 >> 1;
                iVar3 = MultiIndexSet::getSlot(mset,p);
                piVar1[lVar6 + sVar5 * 2] = iVar3;
                p = (int *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_);
                puVar4 = (uint *)(p + sVar5);
                if (iVar3 != -1) break;
                uVar2 = p[sVar5];
              } while (1 < p[sVar5]);
            }
            *puVar4 = -(uint)(uVar8 != 2);
            if (uVar8 == 2) {
              iVar3 = MultiIndexSet::getSlot(mset,p);
              piVar1[lVar6 + sVar5 * 2 + 1] = iVar3;
              p = (int *)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_);
            }
            p[sVar5] = __src[sVar5];
            __n = local_38;
          }
          sVar5 = sVar5 + 1;
        } while (sVar5 != __n);
LAB_001bbf33:
        operator_delete(p,(long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage - (long)p);
      }
      sVar7 = local_40 + 1;
    } while (sVar7 != local_48);
  }
  return local_70;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] >= level0_offset){
                    int current = p[j];
                    dad[j] = RuleLocal::getParent<effrule>(current);
                    pp[2*j] = mset.getSlot(dad);
                    while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                        current = dad[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                    }
                    dad[j] = RuleLocal::getStepParent<effrule>(current);
                    if (dad[j] != -1){
                        pp[2*j + 1] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] == 0){
                    pp[j] = -1;
                }else{
                    dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                    pp[j] = mset.getSlot(dad.data());
                    while((dad[j] != 0) && (pp[j] == -1)){
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }
}